

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int sam_format1(bam_hdr_t *h,bam1_t *b,kstring_t *str)

{
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  ulong uVar3;
  uint8_t *puVar4;
  long lVar5;
  byte bVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  uint uVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  double dVar18;
  undefined6 uStack_38;
  uint8_t key [2];
  
  str->l = 0;
  _uStack_38 = in_RAX;
  kputsn((char *)b->data,(byte)(b->core).field_0xb - 1,str);
  kputc(9,str);
  kputw((uint)*(ushort *)&(b->core).field_0xc,str);
  kputc(9,str);
  lVar2 = (long)(b->core).tid;
  if (lVar2 < 0) {
    kputsn("*\t",2,str);
  }
  else {
    kputs(h->target_name[lVar2],str);
    kputc(9,str);
  }
  kputw((b->core).pos + 1,str);
  kputc(9,str);
  kputw((uint)(byte)(b->core).field_0xa,str);
  kputc(9,str);
  uVar3 = *(ulong *)&(b->core).field_0x8;
  if (uVar3 >> 0x30 == 0) {
    kputc(0x2a,str);
  }
  else {
    uVar11 = uVar3 >> 0x18 & 0xff;
    puVar4 = b->data;
    for (uVar15 = 0; uVar15 < uVar3 >> 0x30; uVar15 = uVar15 + 1) {
      kputw(*(uint *)(puVar4 + uVar15 * 4 + uVar11) >> 4,str);
      kputc((int)"MIDNSHP=XB"[*(uint *)(puVar4 + uVar15 * 4 + uVar11) & 0xf],str);
      uVar3 = *(ulong *)&(b->core).field_0x8;
    }
  }
  kputc(9,str);
  iVar1 = (b->core).mtid;
  if ((long)iVar1 < 0) {
    pcVar10 = "*\t";
  }
  else {
    if (iVar1 != (b->core).tid) {
      kputs(h->target_name[iVar1],str);
      kputc(9,str);
      goto LAB_00111936;
    }
    pcVar10 = "=\t";
  }
  kputsn(pcVar10,2,str);
LAB_00111936:
  kputw((b->core).mpos + 1,str);
  kputc(9,str);
  kputw((b->core).isize,str);
  kputc(9,str);
  iVar1 = (b->core).l_qseq;
  if (iVar1 == 0) {
    kputsn("*\t*",3,str);
  }
  else {
    uVar3 = *(ulong *)&(b->core).field_0x8;
    puVar4 = b->data;
    bVar6 = 0;
    for (uVar14 = 0; (int)uVar14 < iVar1; uVar14 = uVar14 + 1) {
      kputc((int)"=ACMGRSVTWYHKDBN"
                 [puVar4[(ulong)(uVar14 >> 1) + (uVar3 >> 0x18 & 0xff) + (uVar3 >> 0x30) * 4] >>
                  (~bVar6 & 4) & 0xf],str);
      iVar1 = (b->core).l_qseq;
      bVar6 = bVar6 + 4;
    }
    kputc(9,str);
    uVar3 = *(ulong *)&(b->core).field_0x8;
    puVar4 = b->data;
    lVar2 = (uVar3 >> 0x18 & 0xff) + (uVar3 >> 0x30) * 4;
    iVar1 = (b->core).l_qseq;
    lVar5 = (long)(iVar1 + 1 >> 1);
    if (puVar4[lVar5 + lVar2] == 0xff) {
      kputc(0x2a,str);
    }
    else {
      for (lVar12 = 0; lVar12 < iVar1; lVar12 = lVar12 + 1) {
        kputc(puVar4[lVar12 + lVar5 + lVar2] + 0x21,str);
        iVar1 = (b->core).l_qseq;
      }
    }
  }
  uVar3 = *(ulong *)&(b->core).field_0x8;
  puVar4 = b->data;
  iVar1 = (b->core).l_qseq;
  pdVar17 = (double *)
            (puVar4 + (long)iVar1 +
                      (long)(iVar1 + 1 >> 1) + (uVar3 >> 0x18 & 0xff) + (uVar3 >> 0x30) * 4);
  do {
    pdVar13 = (double *)((long)pdVar17 + 4);
    if (puVar4 + b->l_data < pdVar13) {
      return (int)str->l;
    }
    _uStack_38 = CONCAT17(*(undefined1 *)((long)pdVar17 + 1),
                          CONCAT16(*(undefined1 *)pdVar17,uStack_38));
    pdVar16 = (double *)((long)pdVar17 + 3);
    bVar6 = *(byte *)((long)pdVar17 + 2);
    kputc(9,str);
    kputsn((char *)key,2,str);
    kputc(0x3a,str);
    switch(bVar6) {
    case 0x41:
      kputsn("A:",2,str);
      kputc((uint)*(byte *)pdVar16,str);
      break;
    case 0x42:
      fVar8 = *(float *)((long)pdVar17 + 4);
      if (b->data + b->l_data <= (uint8_t *)((long)pdVar17 + (long)(int)fVar8 + 8)) {
        return -1;
      }
      pdVar17 = pdVar17 + 1;
      bVar6 = *(byte *)pdVar16;
      uVar14 = (uint)bVar6;
      kputsn("B:",2,str);
      kputc(uVar14,str);
      if ((int)fVar8 < 1) {
        fVar8 = 0.0;
      }
      while (fVar7 = (float)((int)fVar8 + -1), pdVar16 = pdVar17, fVar8 != 0.0) {
        kputc(0x2c,str);
        fVar8 = fVar7;
        if (bVar6 == 0x43) {
          uVar9 = (uint)*(byte *)pdVar17;
          goto LAB_00111cb1;
        }
        if (uVar14 == 0x49) {
          kputuw((uint)*(float *)pdVar17,str);
          goto LAB_00111ce3;
        }
        if (uVar14 == 0x53) {
          uVar9 = (uint)*(ushort *)pdVar17;
LAB_00111cc6:
          kputw(uVar9,str);
          pdVar17 = (double *)((long)pdVar17 + 2);
        }
        else {
          if (uVar14 == 0x73) {
            uVar9 = (uint)*(short *)pdVar17;
            goto LAB_00111cc6;
          }
          if (uVar14 == 0x66) {
            ksprintf(str,"%g",(double)*(float *)pdVar17);
LAB_00111ce3:
            pdVar17 = (double *)((long)pdVar17 + 4);
          }
          else {
            if (uVar14 == 0x69) {
              kputw((int)*(float *)pdVar17,str);
              goto LAB_00111ce3;
            }
            if (uVar14 == 99) {
              uVar9 = (uint)*(char *)pdVar17;
LAB_00111cb1:
              kputw(uVar9,str);
              pdVar17 = (double *)((long)pdVar17 + 1);
            }
          }
        }
      }
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
switchD_00111aec_caseD_65:
      pdVar13 = pdVar16;
      break;
    case 0x43:
      kputsn("i:",2,str);
      uVar14 = (uint)*(byte *)pdVar16;
LAB_00111bd7:
      kputw(uVar14,str);
      break;
    case 0x48:
switchD_00111b18_caseD_48:
      kputc((uint)bVar6,str);
      uVar14 = 0x3a;
      do {
        kputc(uVar14,str);
        if (b->data + b->l_data <= pdVar16) {
          return -1;
        }
        bVar6 = *(byte *)pdVar16;
        uVar14 = (uint)bVar6;
        pdVar16 = (double *)((long)pdVar16 + 1);
      } while (bVar6 != 0);
      goto switchD_00111aec_caseD_65;
    case 0x49:
      pdVar13 = (double *)((long)pdVar17 + 7);
      if (b->data + b->l_data < pdVar13) {
        return -1;
      }
      kputsn("i:",2,str);
      kputuw((uint)*(float *)pdVar16,str);
      break;
    default:
      switch(bVar6) {
      case 99:
        kputsn("i:",2,str);
        uVar14 = (uint)*(char *)pdVar16;
        goto LAB_00111bd7;
      case 100:
        pdVar13 = (double *)((long)pdVar17 + 0xb);
        if (b->data + b->l_data < pdVar13) {
          return -1;
        }
        dVar18 = *pdVar16;
        pcVar10 = "d:%g";
        break;
      case 0x65:
      case 0x67:
      case 0x68:
        goto switchD_00111aec_caseD_65;
      case 0x66:
        pdVar13 = (double *)((long)pdVar17 + 7);
        if (b->data + b->l_data < pdVar13) {
          return -1;
        }
        dVar18 = (double)*(float *)pdVar16;
        pcVar10 = "f:%g";
        break;
      case 0x69:
        pdVar13 = (double *)((long)pdVar17 + 7);
        if (b->data + b->l_data < pdVar13) {
          return -1;
        }
        kputsn("i:",2,str);
        fVar8 = *(float *)pdVar16;
        goto LAB_00111dca;
      default:
        if (bVar6 == 0x53) {
          pdVar13 = (double *)((long)pdVar17 + 5);
          if (b->data + b->l_data < pdVar13) {
            return -1;
          }
          kputsn("i:",2,str);
          fVar8 = (float)(uint)*(ushort *)pdVar16;
        }
        else {
          if (bVar6 == 0x5a) goto switchD_00111b18_caseD_48;
          if (bVar6 != 0x73) goto switchD_00111aec_caseD_65;
          pdVar13 = (double *)((long)pdVar17 + 5);
          if (b->data + b->l_data < pdVar13) {
            return -1;
          }
          kputsn("i:",2,str);
          fVar8 = (float)(int)*(short *)pdVar16;
        }
LAB_00111dca:
        kputw((int)fVar8,str);
        goto LAB_00111dd5;
      }
      ksprintf(str,pcVar10,dVar18);
    }
LAB_00111dd5:
    puVar4 = b->data;
    pdVar17 = pdVar13;
  } while( true );
}

Assistant:

int sam_format1(const bam_hdr_t *h, const bam1_t *b, kstring_t *str)
{
    int i;
    uint8_t *s;
    const bam1_core_t *c = &b->core;

    str->l = 0;
    kputsn(bam_get_qname(b), c->l_qname-1, str); kputc('\t', str); // query name
    kputw(c->flag, str); kputc('\t', str); // flag
    if (c->tid >= 0) { // chr
        kputs(h->target_name[c->tid] , str);
        kputc('\t', str);
    } else kputsn("*\t", 2, str);
    kputw(c->pos + 1, str); kputc('\t', str); // pos
    kputw(c->qual, str); kputc('\t', str); // qual
    if (c->n_cigar) { // cigar
        uint32_t *cigar = bam_get_cigar(b);
        for (i = 0; i < c->n_cigar; ++i) {
            kputw(bam_cigar_oplen(cigar[i]), str);
            kputc(bam_cigar_opchr(cigar[i]), str);
        }
    } else kputc('*', str);
    kputc('\t', str);
    if (c->mtid < 0) kputsn("*\t", 2, str); // mate chr
    else if (c->mtid == c->tid) kputsn("=\t", 2, str);
    else {
        kputs(h->target_name[c->mtid], str);
        kputc('\t', str);
    }
    kputw(c->mpos + 1, str); kputc('\t', str); // mate pos
    kputw(c->isize, str); kputc('\t', str); // template len
    if (c->l_qseq) { // seq and qual
        uint8_t *s = bam_get_seq(b);
        for (i = 0; i < c->l_qseq; ++i) kputc("=ACMGRSVTWYHKDBN"[bam_seqi(s, i)], str);
        kputc('\t', str);
        s = bam_get_qual(b);
        if (s[0] == 0xff) kputc('*', str);
        else for (i = 0; i < c->l_qseq; ++i) kputc(s[i] + 33, str);
    } else kputsn("*\t*", 3, str);
    s = bam_get_aux(b); // aux
    while (s+4 <= b->data + b->l_data) {
        uint8_t type, key[2];
        key[0] = s[0]; key[1] = s[1];
        s += 2; type = *s++;
        kputc('\t', str); kputsn((char*)key, 2, str); kputc(':', str);
        if (type == 'A') {
            kputsn("A:", 2, str);
            kputc(*s, str);
            ++s;
        } else if (type == 'C') {
            kputsn("i:", 2, str);
            kputw(*s, str);
            ++s;
        } else if (type == 'c') {
            kputsn("i:", 2, str);
            kputw(*(int8_t*)s, str);
            ++s;
        } else if (type == 'S') {
            if (s+2 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(uint16_t*)s, str);
                s += 2;
            } else return -1;
        } else if (type == 's') {
            if (s+2 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(int16_t*)s, str);
                s += 2;
            } else return -1;
        } else if (type == 'I') {
            if (s+4 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputuw(*(uint32_t*)s, str);
                s += 4;
            } else return -1;
        } else if (type == 'i') {
            if (s+4 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(int32_t*)s, str);
                s += 4;
            } else return -1;
        } else if (type == 'f') {
            if (s+4 <= b->data + b->l_data) {
                ksprintf(str, "f:%g", *(float*)s);
                s += 4;
            } else return -1;

        } else if (type == 'd') {
            if (s+8 <= b->data + b->l_data) {
                ksprintf(str, "d:%g", *(double*)s);
                s += 8;
            } else return -1;
        } else if (type == 'Z' || type == 'H') {
            kputc(type, str); kputc(':', str);
            while (s < b->data + b->l_data && *s) kputc(*s++, str);
            if (s >= b->data + b->l_data)
                return -1;
            ++s;
        } else if (type == 'B') {
            uint8_t sub_type = *(s++);
            int32_t n;
            memcpy(&n, s, 4);
            s += 4; // no point to the start of the array
            if (s + n >= b->data + b->l_data)
                return -1;
            kputsn("B:", 2, str); kputc(sub_type, str); // write the typing
            for (i = 0; i < n; ++i) { // FIXME: for better performance, put the loop after "if"
                kputc(',', str);
                if ('c' == sub_type)      { kputw(*(int8_t*)s, str); ++s; }
                else if ('C' == sub_type) { kputw(*(uint8_t*)s, str); ++s; }
                else if ('s' == sub_type) { kputw(*(int16_t*)s, str); s += 2; }
                else if ('S' == sub_type) { kputw(*(uint16_t*)s, str); s += 2; }
                else if ('i' == sub_type) { kputw(*(int32_t*)s, str); s += 4; }
                else if ('I' == sub_type) { kputuw(*(uint32_t*)s, str); s += 4; }
                else if ('f' == sub_type) { ksprintf(str, "%g", *(float*)s); s += 4; }
            }
        }
    }
    return str->l;
}